

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_create_from_ctor(JSContext *ctx,JSValue ctor,int class_id)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue proto_val;
  JSContext *pJVar3;
  ulong uVar4;
  uint uVar5;
  JSValue v;
  JSValue JVar6;
  
  if ((int)ctor.tag == 3) {
    JVar1 = (JSValueUnion)ctx->class_proto[class_id].u.ptr;
    iVar2 = ctx->class_proto[class_id].tag;
    proto_val.tag = iVar2;
    proto_val.u.ptr = JVar1.ptr;
    uVar5 = (uint)iVar2;
joined_r0x00132d13:
    if (0xfffffff4 < uVar5) {
      proto_val.tag = iVar2;
      proto_val.u.ptr = JVar1.ptr;
      *(int *)JVar1.ptr = *JVar1.ptr + 1;
    }
  }
  else {
    v = JS_GetPropertyInternal(ctx,ctor,0x3b,ctor,0);
    proto_val = v;
    if ((int)v.tag != -1) {
      if ((int)v.tag == 6) {
        uVar4 = (ulong)v.u.ptr & 0xffffffff00000000;
        goto LAB_00132d4c;
      }
      JS_FreeValue(ctx,v);
      pJVar3 = JS_GetFunctionRealm(ctx,ctor);
      if (pJVar3 == (JSContext *)0x0) {
        v = (JSValue)(ZEXT816(6) << 0x40);
        uVar4 = 0;
        goto LAB_00132d4c;
      }
      JVar1 = (JSValueUnion)pJVar3->class_proto[class_id].u.ptr;
      iVar2 = pJVar3->class_proto[class_id].tag;
      proto_val.tag = iVar2;
      proto_val.u.ptr = JVar1.ptr;
      uVar5 = (uint)iVar2;
      goto joined_r0x00132d13;
    }
  }
  v = JS_NewObjectProtoClass(ctx,proto_val,class_id);
  JS_FreeValue(ctx,proto_val);
  uVar4 = (ulong)v.u.ptr & 0xffffffff00000000;
LAB_00132d4c:
  JVar6.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar4);
  JVar6.tag = v.tag;
  return JVar6;
}

Assistant:

static JSValue js_create_from_ctor(JSContext *ctx, JSValueConst ctor,
                                   int class_id)
{
    JSValue proto, obj;
    JSContext *realm;
    
    if (JS_IsUndefined(ctor)) {
        proto = JS_DupValue(ctx, ctx->class_proto[class_id]);
    } else {
        proto = JS_GetProperty(ctx, ctor, JS_ATOM_prototype);
        if (JS_IsException(proto))
            return proto;
        if (!JS_IsObject(proto)) {
            JS_FreeValue(ctx, proto);
            realm = JS_GetFunctionRealm(ctx, ctor);
            if (!realm)
                return JS_EXCEPTION;
            proto = JS_DupValue(ctx, realm->class_proto[class_id]);
        }
    }
    obj = JS_NewObjectProtoClass(ctx, proto, class_id);
    JS_FreeValue(ctx, proto);
    return obj;
}